

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  byte bVar20;
  int iVar21;
  uint uVar22;
  undefined4 uVar23;
  long lVar24;
  undefined4 uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong *puVar29;
  ulong *puVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong unaff_R12;
  size_t mask;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  float fVar46;
  float fVar52;
  float fVar53;
  vint4 ai_1;
  undefined1 auVar47 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar58;
  float fVar63;
  float fVar64;
  vint4 ai;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar69;
  float fVar76;
  float fVar77;
  vint4 ai_3;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar78;
  undefined1 auVar75 [32];
  vint4 ai_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  uint uVar101;
  uint uVar102;
  undefined1 auVar99 [16];
  uint uVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx2::UVIdentity<8>_> hit;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_b90;
  undefined8 local_b60;
  uint uStack_b58;
  uint uStack_b54;
  uint uStack_b50;
  uint uStack_b4c;
  uint uStack_b48;
  uint uStack_b44;
  uint local_b40;
  uint uStack_b3c;
  uint uStack_b38;
  uint uStack_b34;
  uint uStack_b30;
  uint uStack_b2c;
  uint uStack_b28;
  uint uStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a60 [32];
  float local_a40 [4];
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20 [4];
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar57 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar122 = ZEXT1664(CONCAT412(fVar57,CONCAT48(fVar57,CONCAT44(fVar57,fVar57))));
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar96._4_4_ = fVar68;
  auVar96._0_4_ = fVar68;
  auVar96._8_4_ = fVar68;
  auVar96._12_4_ = fVar68;
  fVar57 = fVar57 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar104 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar99._4_4_ = fVar104;
  auVar99._0_4_ = fVar104;
  auVar99._8_4_ = fVar104;
  auVar99._12_4_ = fVar104;
  fVar68 = fVar68 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar104 = fVar104 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar107._0_8_ = CONCAT44(fVar57,fVar57) ^ 0x8000000080000000;
  auVar107._8_4_ = -fVar57;
  auVar107._12_4_ = -fVar57;
  auVar110._0_8_ = CONCAT44(fVar68,fVar68) ^ 0x8000000080000000;
  auVar110._8_4_ = -fVar68;
  auVar110._12_4_ = -fVar68;
  auVar113._0_8_ = CONCAT44(fVar104,fVar104) ^ 0x8000000080000000;
  auVar113._8_4_ = -fVar104;
  auVar113._12_4_ = -fVar104;
  iVar21 = (tray->tnear).field_0.i[k];
  auVar116._4_4_ = iVar21;
  auVar116._0_4_ = iVar21;
  auVar116._8_4_ = iVar21;
  auVar116._12_4_ = iVar21;
  iVar21 = (tray->tfar).field_0.i[k];
  auVar119._4_4_ = iVar21;
  auVar119._0_4_ = iVar21;
  auVar119._8_4_ = iVar21;
  auVar119._12_4_ = iVar21;
  local_940._16_16_ = mm_lookupmask_ps._240_16_;
  local_940._0_16_ = mm_lookupmask_ps._0_16_;
  iVar21 = 1 << ((uint)k & 0x1f);
  auVar90._4_4_ = iVar21;
  auVar90._0_4_ = iVar21;
  auVar90._8_4_ = iVar21;
  auVar90._12_4_ = iVar21;
  auVar90._16_4_ = iVar21;
  auVar90._20_4_ = iVar21;
  auVar90._24_4_ = iVar21;
  auVar90._28_4_ = iVar21;
  auVar48 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar90 = vpand_avx2(auVar90,auVar48);
  local_980 = vpcmpeqd_avx2(auVar90,auVar48);
  auVar48._8_4_ = 0xbf800000;
  auVar48._0_8_ = 0xbf800000bf800000;
  auVar48._12_4_ = 0xbf800000;
  auVar48._16_4_ = 0xbf800000;
  auVar48._20_4_ = 0xbf800000;
  auVar48._24_4_ = 0xbf800000;
  auVar48._28_4_ = 0xbf800000;
  auVar59._8_4_ = 0x3f800000;
  auVar59._0_8_ = &DAT_3f8000003f800000;
  auVar59._12_4_ = 0x3f800000;
  auVar59._16_4_ = 0x3f800000;
  auVar59._20_4_ = 0x3f800000;
  auVar59._24_4_ = 0x3f800000;
  auVar59._28_4_ = 0x3f800000;
  _local_960 = vblendvps_avx(auVar59,auVar48,local_940);
  puVar30 = local_7f8;
  do {
    puVar29 = puVar30;
    if (puVar29 == &local_800) break;
    puVar30 = puVar29 + -1;
    uVar39 = puVar29[-1];
    do {
      if ((uVar39 & 8) == 0) {
        auVar85 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar39 + 0x20 + uVar33),auVar107,
                                  auVar122._0_16_);
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar39 + 0x20 + uVar35),auVar110,auVar96);
        auVar85 = vpmaxsd_avx(auVar85,auVar47);
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar39 + 0x20 + uVar36),auVar113,auVar99);
        auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar39 + 0x20 + (uVar33 ^ 0x10)),auVar107,
                                  auVar122._0_16_);
        auVar70 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar39 + 0x20 + (uVar35 ^ 0x10)),auVar110,
                                  auVar96);
        auVar80 = vpminsd_avx(auVar80,auVar70);
        auVar70 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar39 + 0x20 + (uVar36 ^ 0x10)),auVar113,
                                  auVar99);
        auVar47 = vpmaxsd_avx(auVar47,auVar116);
        auVar85 = vpmaxsd_avx(auVar85,auVar47);
        auVar47 = vpminsd_avx(auVar70,auVar119);
        auVar47 = vpminsd_avx(auVar80,auVar47);
        auVar85 = vpcmpgtd_avx(auVar85,auVar47);
        uVar22 = vmovmskps_avx(auVar85);
        unaff_R12 = ((ulong)uVar22 ^ 0xf) & 0xff;
      }
      if ((uVar39 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar22 = 4;
        }
        else {
          uVar38 = uVar39 & 0xfffffffffffffff0;
          lVar28 = 0;
          for (uVar39 = unaff_R12; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
            lVar28 = lVar28 + 1;
          }
          uVar22 = 0;
          for (uVar26 = unaff_R12 - 1 & unaff_R12; uVar39 = *(ulong *)(uVar38 + lVar28 * 8),
              uVar26 != 0; uVar26 = uVar26 - 1 & uVar26) {
            *puVar30 = uVar39;
            puVar30 = puVar30 + 1;
            lVar28 = 0;
            for (uVar39 = uVar26; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
          }
        }
      }
      else {
        uVar22 = 6;
      }
    } while (uVar22 == 0);
    if (uVar22 == 6) {
      uVar38 = (ulong)((uint)uVar39 & 0xf);
      uVar26 = uVar38 - 8;
      bVar44 = uVar38 != 8;
      if (bVar44) {
        uVar39 = uVar39 & 0xfffffffffffffff0;
        uVar38 = 0;
        do {
          lVar24 = uVar38 * 0x58;
          lVar28 = lVar24 + uVar39;
          uVar23 = *(undefined4 *)(uVar39 + 0x38 + lVar24);
          auVar70._4_4_ = uVar23;
          auVar70._0_4_ = uVar23;
          auVar70._8_4_ = uVar23;
          auVar70._12_4_ = uVar23;
          uVar23 = *(undefined4 *)(uVar39 + 0x44 + lVar24);
          auVar79._4_4_ = uVar23;
          auVar79._0_4_ = uVar23;
          auVar79._8_4_ = uVar23;
          auVar79._12_4_ = uVar23;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = *(ulong *)((uVar33 >> 2) + 0x20 + lVar28);
          auVar85 = vpmovzxbd_avx(auVar85);
          auVar85 = vcvtdq2ps_avx(auVar85);
          auVar80 = vfmadd213ps_fma(auVar85,auVar79,auVar70);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)(((uVar33 ^ 0x10) >> 2) + 0x20 + lVar28);
          auVar85 = vpmovzxbd_avx(auVar47);
          auVar85 = vcvtdq2ps_avx(auVar85);
          auVar70 = vfmadd213ps_fma(auVar85,auVar79,auVar70);
          uVar23 = *(undefined4 *)(uVar39 + 0x3c + lVar24);
          auVar82._4_4_ = uVar23;
          auVar82._0_4_ = uVar23;
          auVar82._8_4_ = uVar23;
          auVar82._12_4_ = uVar23;
          uVar23 = *(undefined4 *)(uVar39 + 0x48 + lVar24);
          auVar87._4_4_ = uVar23;
          auVar87._0_4_ = uVar23;
          auVar87._8_4_ = uVar23;
          auVar87._12_4_ = uVar23;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = *(ulong *)((uVar35 >> 2) + 0x20 + lVar28);
          auVar85 = vpmovzxbd_avx(auVar71);
          auVar85 = vcvtdq2ps_avx(auVar85);
          auVar71 = vfmadd213ps_fma(auVar85,auVar87,auVar82);
          auVar72._8_8_ = 0;
          auVar72._0_8_ = *(ulong *)(((uVar35 ^ 0x10) >> 2) + 0x20 + lVar28);
          auVar85 = vpmovzxbd_avx(auVar72);
          auVar85 = vcvtdq2ps_avx(auVar85);
          auVar72 = vfmadd213ps_fma(auVar85,auVar87,auVar82);
          uVar23 = *(undefined4 *)(uVar39 + 0x40 + lVar24);
          auVar83._4_4_ = uVar23;
          auVar83._0_4_ = uVar23;
          auVar83._8_4_ = uVar23;
          auVar83._12_4_ = uVar23;
          uVar23 = *(undefined4 *)(uVar39 + 0x4c + lVar24);
          auVar88._4_4_ = uVar23;
          auVar88._0_4_ = uVar23;
          auVar88._8_4_ = uVar23;
          auVar88._12_4_ = uVar23;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = *(ulong *)((uVar36 >> 2) + 0x20 + lVar28);
          auVar85 = vpmovzxbd_avx(auVar91);
          auVar85 = vcvtdq2ps_avx(auVar85);
          auVar79 = vfmadd213ps_fma(auVar85,auVar88,auVar83);
          auVar92._8_8_ = 0;
          auVar92._0_8_ = *(ulong *)(((uVar36 ^ 0x10) >> 2) + 0x20 + lVar28);
          auVar85 = vpmovzxbd_avx(auVar92);
          auVar85 = vcvtdq2ps_avx(auVar85);
          auVar82 = vfmadd213ps_fma(auVar85,auVar88,auVar83);
          auVar84._8_8_ = 0;
          auVar84._0_8_ = *(ulong *)(uVar39 + 0x20 + lVar24);
          auVar89._8_8_ = 0;
          auVar89._0_8_ = *(ulong *)(uVar39 + 0x24 + lVar24);
          auVar47 = vpminub_avx(auVar84,auVar89);
          auVar85 = vpcmpeqb_avx(auVar84,auVar47);
          auVar47 = vpcmpeqd_avx(auVar47,auVar47);
          auVar85 = vpmovzxbd_avx(auVar85 ^ auVar47);
          auVar85 = vpslld_avx(auVar85 ^ auVar47,0x1f);
          uVar25 = vmovmskps_avx(auVar85);
          auVar85 = vfmadd213ps_fma(auVar80,auVar122._0_16_,auVar107);
          auVar47 = vfmadd213ps_fma(auVar71,auVar96,auVar110);
          auVar85 = vpmaxsd_avx(auVar85,auVar47);
          auVar47 = vfmadd213ps_fma(auVar70,auVar122._0_16_,auVar107);
          auVar80 = vfmadd213ps_fma(auVar72,auVar96,auVar110);
          auVar80 = vpminsd_avx(auVar47,auVar80);
          auVar47 = vfmadd213ps_fma(auVar79,auVar99,auVar113);
          auVar47 = vpmaxsd_avx(auVar47,auVar116);
          auVar85 = vpmaxsd_avx(auVar85,auVar47);
          auVar47 = vfmadd213ps_fma(auVar82,auVar99,auVar113);
          auVar47 = vpminsd_avx(auVar47,auVar119);
          auVar47 = vpminsd_avx(auVar80,auVar47);
          auVar85 = vpcmpgtd_avx(auVar85,auVar47);
          uVar23 = vmovmskps_avx(auVar85);
          bVar20 = ~(byte)uVar23 & (byte)uVar25;
          if (bVar20 != 0) {
            uVar43 = (ulong)bVar20;
            do {
              lVar24 = 0;
              for (uVar37 = uVar43; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                lVar24 = lVar24 + 1;
              }
              uVar2 = *(ushort *)(lVar28 + lVar24 * 8);
              uVar3 = *(ushort *)(lVar28 + 2 + lVar24 * 8);
              local_b40 = *(uint *)(lVar28 + 0x50);
              uStack_b58 = *(uint *)(lVar28 + 4 + lVar24 * 8);
              pGVar4 = (context->scene->geometries).items[local_b40].ptr;
              lVar24 = *(long *)&pGVar4->field_0x58;
              lVar31 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       (ulong)uStack_b58;
              uVar32 = uVar2 & 0x7fff;
              uVar34 = uVar3 & 0x7fff;
              uVar22 = *(uint *)(lVar24 + 4 + lVar31);
              uVar42 = (ulong)uVar22;
              uVar27 = (ulong)(uVar22 * uVar34 + *(int *)(lVar24 + lVar31) + uVar32);
              p_Var5 = pGVar4[1].intersectionFilterN;
              lVar6 = *(long *)&pGVar4[1].time_range.upper;
              auVar85 = *(undefined1 (*) [16])(lVar6 + (uVar27 + 1) * (long)p_Var5);
              auVar47 = *(undefined1 (*) [16])(lVar6 + (uVar27 + uVar42) * (long)p_Var5);
              lVar41 = uVar27 + uVar42 + 1;
              auVar80 = *(undefined1 (*) [16])(lVar6 + lVar41 * (long)p_Var5);
              auVar70 = *(undefined1 (*) [16])
                         (lVar6 + (uVar27 + (-1 < (short)uVar2) + 1) * (long)p_Var5);
              lVar40 = (ulong)(-1 < (short)uVar2) + lVar41;
              auVar71 = *(undefined1 (*) [16])(lVar6 + lVar40 * (long)p_Var5);
              uVar37 = 0;
              if (-1 < (short)uVar3) {
                uVar37 = uVar42;
              }
              auVar72 = *(undefined1 (*) [16])(lVar6 + (uVar27 + uVar42 + uVar37) * (long)p_Var5);
              auVar79 = *(undefined1 (*) [16])(lVar6 + (lVar41 + uVar37) * (long)p_Var5);
              auVar97._16_16_ = *(undefined1 (*) [16])(lVar6 + (uVar37 + lVar40) * (long)p_Var5);
              auVar97._0_16_ = auVar80;
              auVar83 = vunpcklps_avx(auVar85,auVar71);
              auVar82 = vunpckhps_avx(auVar85,auVar71);
              auVar84 = vunpcklps_avx(auVar70,auVar80);
              auVar70 = vunpckhps_avx(auVar70,auVar80);
              auVar87 = vunpcklps_avx(auVar82,auVar70);
              auVar88 = vunpcklps_avx(auVar83,auVar84);
              auVar70 = vunpckhps_avx(auVar83,auVar84);
              auVar83 = vunpcklps_avx(auVar47,auVar79);
              auVar82 = vunpckhps_avx(auVar47,auVar79);
              auVar84 = vunpcklps_avx(auVar80,auVar72);
              auVar72 = vunpckhps_avx(auVar80,auVar72);
              auVar82 = vunpcklps_avx(auVar82,auVar72);
              auVar89 = vunpcklps_avx(auVar83,auVar84);
              auVar72 = vunpckhps_avx(auVar83,auVar84);
              auVar73._16_16_ = auVar79;
              auVar73._0_16_ = auVar47;
              auVar60._16_16_ = auVar71;
              auVar60._0_16_ = auVar85;
              auVar90 = vunpcklps_avx(auVar60,auVar73);
              auVar49._16_16_ = auVar80;
              auVar49._0_16_ = *(undefined1 (*) [16])(lVar6 + (long)p_Var5 * uVar27);
              auVar48 = vunpcklps_avx(auVar49,auVar97);
              auVar10 = vunpcklps_avx(auVar48,auVar90);
              auVar9 = vunpckhps_avx(auVar48,auVar90);
              auVar90 = vunpckhps_avx(auVar60,auVar73);
              auVar48 = vunpckhps_avx(auVar49,auVar97);
              auVar60 = vunpcklps_avx(auVar48,auVar90);
              auVar50._16_16_ = auVar88;
              auVar50._0_16_ = auVar88;
              auVar61._16_16_ = auVar70;
              auVar61._0_16_ = auVar70;
              auVar81._16_16_ = auVar87;
              auVar81._0_16_ = auVar87;
              auVar94._16_16_ = auVar89;
              auVar94._0_16_ = auVar89;
              auVar108._16_16_ = auVar72;
              auVar108._0_16_ = auVar72;
              auVar111._16_16_ = auVar82;
              auVar111._0_16_ = auVar82;
              auVar48 = vsubps_avx(auVar10,auVar50);
              auVar90 = vsubps_avx(auVar9,auVar61);
              auVar59 = vsubps_avx(auVar60,auVar81);
              auVar49 = vsubps_avx(auVar94,auVar10);
              auVar7 = vsubps_avx(auVar108,auVar9);
              auVar8 = vsubps_avx(auVar111,auVar60);
              auVar11._4_4_ = auVar90._4_4_ * auVar8._4_4_;
              auVar11._0_4_ = auVar90._0_4_ * auVar8._0_4_;
              auVar11._8_4_ = auVar90._8_4_ * auVar8._8_4_;
              auVar11._12_4_ = auVar90._12_4_ * auVar8._12_4_;
              auVar11._16_4_ = auVar90._16_4_ * auVar8._16_4_;
              auVar11._20_4_ = auVar90._20_4_ * auVar8._20_4_;
              auVar11._24_4_ = auVar90._24_4_ * auVar8._24_4_;
              auVar11._28_4_ = auVar88._12_4_;
              auVar71 = vfmsub231ps_fma(auVar11,auVar7,auVar59);
              auVar12._4_4_ = auVar59._4_4_ * auVar49._4_4_;
              auVar12._0_4_ = auVar59._0_4_ * auVar49._0_4_;
              auVar12._8_4_ = auVar59._8_4_ * auVar49._8_4_;
              auVar12._12_4_ = auVar59._12_4_ * auVar49._12_4_;
              auVar12._16_4_ = auVar59._16_4_ * auVar49._16_4_;
              auVar12._20_4_ = auVar59._20_4_ * auVar49._20_4_;
              auVar12._24_4_ = auVar59._24_4_ * auVar49._24_4_;
              auVar12._28_4_ = auVar70._12_4_;
              auVar70 = vfmsub231ps_fma(auVar12,auVar8,auVar48);
              uVar23 = *(undefined4 *)(ray + k * 4);
              auVar114._4_4_ = uVar23;
              auVar114._0_4_ = uVar23;
              auVar114._8_4_ = uVar23;
              auVar114._12_4_ = uVar23;
              auVar114._16_4_ = uVar23;
              auVar114._20_4_ = uVar23;
              auVar114._24_4_ = uVar23;
              auVar114._28_4_ = uVar23;
              uVar23 = *(undefined4 *)(ray + k * 4 + 0x20);
              auVar117._4_4_ = uVar23;
              auVar117._0_4_ = uVar23;
              auVar117._8_4_ = uVar23;
              auVar117._12_4_ = uVar23;
              auVar117._16_4_ = uVar23;
              auVar117._20_4_ = uVar23;
              auVar117._24_4_ = uVar23;
              auVar117._28_4_ = uVar23;
              uVar23 = *(undefined4 *)(ray + k * 4 + 0x40);
              auVar120._4_4_ = uVar23;
              auVar120._0_4_ = uVar23;
              auVar120._8_4_ = uVar23;
              auVar120._12_4_ = uVar23;
              auVar120._16_4_ = uVar23;
              auVar120._20_4_ = uVar23;
              auVar120._24_4_ = uVar23;
              auVar120._28_4_ = uVar23;
              fVar57 = *(float *)(ray + k * 4 + 0x80);
              auVar109._4_4_ = fVar57;
              auVar109._0_4_ = fVar57;
              auVar109._8_4_ = fVar57;
              auVar109._12_4_ = fVar57;
              auVar109._16_4_ = fVar57;
              auVar109._20_4_ = fVar57;
              auVar109._24_4_ = fVar57;
              auVar109._28_4_ = fVar57;
              auVar10 = vsubps_avx(auVar10,auVar114);
              fVar68 = *(float *)(ray + k * 4 + 0xa0);
              auVar115._4_4_ = fVar68;
              auVar115._0_4_ = fVar68;
              auVar115._8_4_ = fVar68;
              auVar115._12_4_ = fVar68;
              auVar115._16_4_ = fVar68;
              auVar115._20_4_ = fVar68;
              auVar115._24_4_ = fVar68;
              auVar115._28_4_ = fVar68;
              auVar9 = vsubps_avx(auVar9,auVar117);
              fVar104 = *(float *)(ray + k * 4 + 0xc0);
              auVar118._4_4_ = fVar104;
              auVar118._0_4_ = fVar104;
              auVar118._8_4_ = fVar104;
              auVar118._12_4_ = fVar104;
              auVar118._16_4_ = fVar104;
              auVar118._20_4_ = fVar104;
              auVar118._24_4_ = fVar104;
              auVar118._28_4_ = fVar104;
              auVar60 = vsubps_avx(auVar60,auVar120);
              auVar13._4_4_ = fVar57 * auVar9._4_4_;
              auVar13._0_4_ = fVar57 * auVar9._0_4_;
              auVar13._8_4_ = fVar57 * auVar9._8_4_;
              auVar13._12_4_ = fVar57 * auVar9._12_4_;
              auVar13._16_4_ = fVar57 * auVar9._16_4_;
              auVar13._20_4_ = fVar57 * auVar9._20_4_;
              auVar13._24_4_ = fVar57 * auVar9._24_4_;
              auVar13._28_4_ = uVar23;
              auVar85 = vfmsub231ps_fma(auVar13,auVar10,auVar115);
              auVar14._4_4_ = auVar8._4_4_ * auVar85._4_4_;
              auVar14._0_4_ = auVar8._0_4_ * auVar85._0_4_;
              auVar14._8_4_ = auVar8._8_4_ * auVar85._8_4_;
              auVar14._12_4_ = auVar8._12_4_ * auVar85._12_4_;
              auVar14._16_4_ = auVar8._16_4_ * 0.0;
              auVar14._20_4_ = auVar8._20_4_ * 0.0;
              auVar14._24_4_ = auVar8._24_4_ * 0.0;
              auVar14._28_4_ = auVar8._28_4_;
              auVar121._0_4_ = auVar59._0_4_ * auVar85._0_4_;
              auVar121._4_4_ = auVar59._4_4_ * auVar85._4_4_;
              auVar121._8_4_ = auVar59._8_4_ * auVar85._8_4_;
              auVar121._12_4_ = auVar59._12_4_ * auVar85._12_4_;
              auVar121._16_4_ = auVar59._16_4_ * 0.0;
              auVar121._20_4_ = auVar59._20_4_ * 0.0;
              auVar121._24_4_ = auVar59._24_4_ * 0.0;
              auVar121._28_4_ = 0;
              auVar8._4_4_ = fVar104 * auVar10._4_4_;
              auVar8._0_4_ = fVar104 * auVar10._0_4_;
              auVar8._8_4_ = fVar104 * auVar10._8_4_;
              auVar8._12_4_ = fVar104 * auVar10._12_4_;
              auVar8._16_4_ = fVar104 * auVar10._16_4_;
              auVar8._20_4_ = fVar104 * auVar10._20_4_;
              auVar8._24_4_ = fVar104 * auVar10._24_4_;
              auVar8._28_4_ = auVar59._28_4_;
              auVar47 = vfmsub231ps_fma(auVar8,auVar60,auVar109);
              auVar85 = vfmadd231ps_fma(auVar14,ZEXT1632(auVar47),auVar7);
              auVar47 = vfmadd231ps_fma(auVar121,auVar90,ZEXT1632(auVar47));
              auVar15._4_4_ = auVar48._4_4_ * auVar7._4_4_;
              auVar15._0_4_ = auVar48._0_4_ * auVar7._0_4_;
              auVar15._8_4_ = auVar48._8_4_ * auVar7._8_4_;
              auVar15._12_4_ = auVar48._12_4_ * auVar7._12_4_;
              auVar15._16_4_ = auVar48._16_4_ * auVar7._16_4_;
              auVar15._20_4_ = auVar48._20_4_ * auVar7._20_4_;
              auVar15._24_4_ = auVar48._24_4_ * auVar7._24_4_;
              auVar15._28_4_ = auVar7._28_4_;
              auVar80 = vfmsub231ps_fma(auVar15,auVar49,auVar90);
              auVar7._4_4_ = fVar68 * auVar60._4_4_;
              auVar7._0_4_ = fVar68 * auVar60._0_4_;
              auVar7._8_4_ = fVar68 * auVar60._8_4_;
              auVar7._12_4_ = fVar68 * auVar60._12_4_;
              auVar7._16_4_ = fVar68 * auVar60._16_4_;
              auVar7._20_4_ = fVar68 * auVar60._20_4_;
              auVar7._24_4_ = fVar68 * auVar60._24_4_;
              auVar7._28_4_ = auVar90._28_4_;
              auVar72 = vfmsub231ps_fma(auVar7,auVar9,auVar118);
              fVar57 = auVar80._0_4_;
              fVar68 = auVar80._4_4_;
              auVar16._4_4_ = fVar104 * fVar68;
              auVar16._0_4_ = fVar104 * fVar57;
              fVar46 = auVar80._8_4_;
              auVar16._8_4_ = fVar104 * fVar46;
              fVar52 = auVar80._12_4_;
              auVar16._12_4_ = fVar104 * fVar52;
              auVar16._16_4_ = fVar104 * 0.0;
              auVar16._20_4_ = fVar104 * 0.0;
              auVar16._24_4_ = fVar104 * 0.0;
              auVar16._28_4_ = fVar104;
              auVar80 = vfmadd231ps_fma(auVar16,ZEXT1632(auVar70),auVar115);
              auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar71),auVar109);
              auVar100._8_4_ = 0x80000000;
              auVar100._0_8_ = 0x8000000080000000;
              auVar100._12_4_ = 0x80000000;
              auVar100._16_4_ = 0x80000000;
              auVar100._20_4_ = 0x80000000;
              auVar100._24_4_ = 0x80000000;
              auVar100._28_4_ = 0x80000000;
              auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),ZEXT1632(auVar72),auVar49);
              auVar90 = vandps_avx(ZEXT1632(auVar80),auVar100);
              uVar22 = auVar90._0_4_;
              auVar95._0_4_ = (float)(uVar22 ^ auVar85._0_4_);
              uVar101 = auVar90._4_4_;
              auVar95._4_4_ = (float)(uVar101 ^ auVar85._4_4_);
              uVar102 = auVar90._8_4_;
              auVar95._8_4_ = (float)(uVar102 ^ auVar85._8_4_);
              uVar103 = auVar90._12_4_;
              auVar95._12_4_ = (float)(uVar103 ^ auVar85._12_4_);
              fVar104 = auVar90._16_4_;
              auVar95._16_4_ = fVar104;
              fVar105 = auVar90._20_4_;
              auVar95._20_4_ = fVar105;
              fVar106 = auVar90._24_4_;
              auVar95._24_4_ = fVar106;
              fVar53 = auVar90._28_4_;
              auVar95._28_4_ = fVar53;
              auVar85 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar48,ZEXT1632(auVar72));
              auVar98._0_4_ = (float)(uVar22 ^ auVar85._0_4_);
              auVar98._4_4_ = (float)(uVar101 ^ auVar85._4_4_);
              auVar98._8_4_ = (float)(uVar102 ^ auVar85._8_4_);
              auVar98._12_4_ = (float)(uVar103 ^ auVar85._12_4_);
              auVar98._16_4_ = fVar104;
              auVar98._20_4_ = fVar105;
              auVar98._24_4_ = fVar106;
              auVar98._28_4_ = fVar53;
              auVar90 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,5);
              auVar48 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,5);
              auVar90 = vandps_avx(auVar48,auVar90);
              auVar74._8_4_ = 0x7fffffff;
              auVar74._0_8_ = 0x7fffffff7fffffff;
              auVar74._12_4_ = 0x7fffffff;
              auVar74._16_4_ = 0x7fffffff;
              auVar74._20_4_ = 0x7fffffff;
              auVar74._24_4_ = 0x7fffffff;
              auVar74._28_4_ = 0x7fffffff;
              local_aa0 = vandps_avx(ZEXT1632(auVar80),auVar74);
              auVar48 = vcmpps_avx(ZEXT1632(auVar80),ZEXT832(0) << 0x20,4);
              auVar90 = vandps_avx(auVar90,auVar48);
              auVar112._0_4_ = auVar98._0_4_ + auVar95._0_4_;
              auVar112._4_4_ = auVar98._4_4_ + auVar95._4_4_;
              auVar112._8_4_ = auVar98._8_4_ + auVar95._8_4_;
              auVar112._12_4_ = auVar98._12_4_ + auVar95._12_4_;
              auVar112._16_4_ = fVar104 + fVar104;
              auVar112._20_4_ = fVar105 + fVar105;
              auVar112._24_4_ = fVar106 + fVar106;
              auVar112._28_4_ = fVar53 + fVar53;
              auVar48 = vcmpps_avx(auVar112,local_aa0,2);
              auVar59 = auVar48 & auVar90;
              if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar59 >> 0x7f,0) != '\0') ||
                    (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar59 >> 0xbf,0) != '\0') ||
                  (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar59[0x1f] < '\0') {
                auVar90 = vandps_avx(auVar90,auVar48);
                auVar85 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
                auVar17._4_4_ = fVar68 * auVar60._4_4_;
                auVar17._0_4_ = fVar57 * auVar60._0_4_;
                auVar17._8_4_ = fVar46 * auVar60._8_4_;
                auVar17._12_4_ = fVar52 * auVar60._12_4_;
                auVar17._16_4_ = auVar60._16_4_ * 0.0;
                auVar17._20_4_ = auVar60._20_4_ * 0.0;
                auVar17._24_4_ = auVar60._24_4_ * 0.0;
                auVar17._28_4_ = auVar60._28_4_;
                auVar47 = vfmadd213ps_fma(auVar9,ZEXT1632(auVar70),auVar17);
                auVar47 = vfmadd213ps_fma(auVar10,ZEXT1632(auVar71),ZEXT1632(auVar47));
                local_ac0._0_4_ = (float)(uVar22 ^ auVar47._0_4_);
                local_ac0._4_4_ = (float)(uVar101 ^ auVar47._4_4_);
                local_ac0._8_4_ = (float)(uVar102 ^ auVar47._8_4_);
                local_ac0._12_4_ = (float)(uVar103 ^ auVar47._12_4_);
                local_ac0._16_4_ = fVar104;
                local_ac0._20_4_ = fVar105;
                local_ac0._24_4_ = fVar106;
                local_ac0._28_4_ = fVar53;
                fVar53 = *(float *)(ray + k * 4 + 0x60);
                fVar58 = local_aa0._0_4_;
                fVar63 = local_aa0._4_4_;
                auVar10._4_4_ = fVar63 * fVar53;
                auVar10._0_4_ = fVar58 * fVar53;
                fVar64 = local_aa0._8_4_;
                auVar10._8_4_ = fVar64 * fVar53;
                fVar65 = local_aa0._12_4_;
                auVar10._12_4_ = fVar65 * fVar53;
                fVar66 = local_aa0._16_4_;
                auVar10._16_4_ = fVar66 * fVar53;
                fVar67 = local_aa0._20_4_;
                auVar10._20_4_ = fVar67 * fVar53;
                fVar69 = local_aa0._24_4_;
                auVar10._24_4_ = fVar69 * fVar53;
                auVar10._28_4_ = fVar53;
                auVar90 = vcmpps_avx(auVar10,local_ac0,1);
                fVar53 = *(float *)(ray + k * 4 + 0x100);
                auVar9._4_4_ = fVar63 * fVar53;
                auVar9._0_4_ = fVar58 * fVar53;
                auVar9._8_4_ = fVar64 * fVar53;
                auVar9._12_4_ = fVar65 * fVar53;
                auVar9._16_4_ = fVar66 * fVar53;
                auVar9._20_4_ = fVar67 * fVar53;
                auVar9._24_4_ = fVar69 * fVar53;
                auVar9._28_4_ = fVar53;
                auVar48 = vcmpps_avx(local_ac0,auVar9,2);
                auVar90 = vandps_avx(auVar90,auVar48);
                auVar47 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
                auVar85 = vpand_avx(auVar85,auVar47);
                auVar90 = vpmovzxwd_avx2(auVar85);
                auVar90 = vpslld_avx2(auVar90,0x1f);
                if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar90 >> 0x7f,0) != '\0') ||
                      (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar90 >> 0xbf,0) != '\0') ||
                    (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar90[0x1f] < '\0') {
                  local_a60 = vpsrad_avx2(auVar90,0x1f);
                  auVar90 = vsubps_avx(local_aa0,auVar98);
                  auVar90 = vblendvps_avx(auVar95,auVar90,local_940);
                  auVar48 = vsubps_avx(local_aa0,auVar95);
                  auVar48 = vblendvps_avx(auVar98,auVar48,local_940);
                  local_9e0._0_4_ = (float)local_960._0_4_ * auVar71._0_4_;
                  local_9e0._4_4_ = (float)local_960._4_4_ * auVar71._4_4_;
                  local_9e0._8_4_ = fStack_958 * auVar71._8_4_;
                  local_9e0._12_4_ = fStack_954 * auVar71._12_4_;
                  local_9e0._16_4_ = fStack_950 * 0.0;
                  local_9e0._20_4_ = fStack_94c * 0.0;
                  local_9e0._24_4_ = fStack_948 * 0.0;
                  local_9e0._28_4_ = 0;
                  local_9c0._4_4_ = (float)local_960._4_4_ * auVar70._4_4_;
                  local_9c0._0_4_ = (float)local_960._0_4_ * auVar70._0_4_;
                  local_9c0._8_4_ = fStack_958 * auVar70._8_4_;
                  local_9c0._12_4_ = fStack_954 * auVar70._12_4_;
                  local_9c0._16_4_ = fStack_950 * 0.0;
                  local_9c0._20_4_ = fStack_94c * 0.0;
                  local_9c0._24_4_ = fStack_948 * 0.0;
                  local_9c0._28_4_ = 0;
                  local_9a0._4_4_ = (float)local_960._4_4_ * fVar68;
                  local_9a0._0_4_ = (float)local_960._0_4_ * fVar57;
                  local_9a0._8_4_ = fStack_958 * fVar46;
                  local_9a0._12_4_ = fStack_954 * fVar52;
                  local_9a0._16_4_ = fStack_950 * 0.0;
                  local_9a0._20_4_ = fStack_94c * 0.0;
                  local_9a0._24_4_ = fStack_948 * 0.0;
                  local_9a0._28_4_ = 0;
                  auVar51._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                  auVar51._8_4_ = uVar32;
                  auVar51._12_4_ = uVar32;
                  auVar51._16_4_ = uVar32;
                  auVar51._20_4_ = uVar32;
                  auVar51._24_4_ = uVar32;
                  auVar51._28_4_ = uVar32;
                  auVar59 = vpaddd_avx2(auVar51,_DAT_0205d4c0);
                  auVar80._0_4_ = (float)(int)(*(ushort *)(lVar24 + 8 + lVar31) - 1);
                  auVar80._4_12_ = auVar122._4_12_;
                  auVar62._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                  auVar62._8_4_ = uVar34;
                  auVar62._12_4_ = uVar34;
                  auVar62._16_4_ = uVar34;
                  auVar62._20_4_ = uVar34;
                  auVar62._24_4_ = uVar34;
                  auVar62._28_4_ = uVar34;
                  auVar49 = vpaddd_avx2(auVar62,_DAT_0205d4e0);
                  auVar85 = vrcpss_avx(auVar80,auVar80);
                  auVar93._0_4_ = (float)(int)(*(ushort *)(lVar24 + 10 + lVar31) - 1);
                  auVar93._4_12_ = auVar122._4_12_;
                  auVar47 = vfnmadd213ss_fma(auVar80,auVar85,SUB6416(ZEXT464(0x40000000),0));
                  fVar57 = auVar85._0_4_ * auVar47._0_4_;
                  auVar85 = vrcpss_avx(auVar93,auVar93);
                  auVar47 = vfnmadd213ss_fma(auVar93,auVar85,SUB6416(ZEXT464(0x40000000),0));
                  fVar68 = auVar85._0_4_ * auVar47._0_4_;
                  auVar59 = vcvtdq2ps_avx(auVar59);
                  fStack_a24 = auVar59._28_4_ + auVar90._28_4_;
                  fVar46 = (fVar58 * auVar59._0_4_ + auVar90._0_4_) * fVar57;
                  fVar52 = (fVar63 * auVar59._4_4_ + auVar90._4_4_) * fVar57;
                  local_b00._4_4_ = fVar52;
                  local_b00._0_4_ = fVar46;
                  fVar53 = (fVar64 * auVar59._8_4_ + auVar90._8_4_) * fVar57;
                  local_b00._8_4_ = fVar53;
                  fVar54 = (fVar65 * auVar59._12_4_ + auVar90._12_4_) * fVar57;
                  local_b00._12_4_ = fVar54;
                  fVar55 = (fVar66 * auVar59._16_4_ + auVar90._16_4_) * fVar57;
                  local_b00._16_4_ = fVar55;
                  fVar56 = (fVar67 * auVar59._20_4_ + auVar90._20_4_) * fVar57;
                  local_b00._20_4_ = fVar56;
                  fVar57 = (fVar69 * auVar59._24_4_ + auVar90._24_4_) * fVar57;
                  local_b00._24_4_ = fVar57;
                  local_b00._28_4_ = fStack_a24;
                  auVar90 = vcvtdq2ps_avx(auVar49);
                  fVar58 = (fVar58 * auVar90._0_4_ + auVar48._0_4_) * fVar68;
                  fVar63 = (fVar63 * auVar90._4_4_ + auVar48._4_4_) * fVar68;
                  local_ae0._4_4_ = fVar63;
                  local_ae0._0_4_ = fVar58;
                  fVar64 = (fVar64 * auVar90._8_4_ + auVar48._8_4_) * fVar68;
                  local_ae0._8_4_ = fVar64;
                  fVar65 = (fVar65 * auVar90._12_4_ + auVar48._12_4_) * fVar68;
                  local_ae0._12_4_ = fVar65;
                  fVar66 = (fVar66 * auVar90._16_4_ + auVar48._16_4_) * fVar68;
                  local_ae0._16_4_ = fVar66;
                  fVar67 = (fVar67 * auVar90._20_4_ + auVar48._20_4_) * fVar68;
                  local_ae0._20_4_ = fVar67;
                  fVar68 = (fVar69 * auVar90._24_4_ + auVar48._24_4_) * fVar68;
                  local_ae0._24_4_ = fVar68;
                  local_ae0._28_4_ = auVar90._28_4_ + auVar48._28_4_;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00616fe7;
                    auVar90 = vrcpps_avx(local_aa0);
                    auVar86._8_4_ = 0x3f800000;
                    auVar86._0_8_ = &DAT_3f8000003f800000;
                    auVar86._12_4_ = 0x3f800000;
                    auVar86._16_4_ = 0x3f800000;
                    auVar86._20_4_ = 0x3f800000;
                    auVar86._24_4_ = 0x3f800000;
                    auVar86._28_4_ = 0x3f800000;
                    auVar85 = vfnmadd213ps_fma(local_aa0,auVar90,auVar86);
                    auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar90,auVar90);
                    fVar69 = auVar85._0_4_;
                    fVar76 = auVar85._4_4_;
                    local_a00._4_4_ = fVar76 * local_ac0._4_4_;
                    local_a00._0_4_ = fVar69 * local_ac0._0_4_;
                    fVar77 = auVar85._8_4_;
                    local_a00._8_4_ = fVar77 * local_ac0._8_4_;
                    fVar78 = auVar85._12_4_;
                    local_a00._12_4_ = fVar78 * local_ac0._12_4_;
                    local_a00._16_4_ = fVar104 * 0.0;
                    local_a00._20_4_ = fVar105 * 0.0;
                    local_a00._24_4_ = fVar106 * 0.0;
                    local_a00._28_4_ = auVar90._28_4_;
                    local_a40[0] = fVar46 * fVar69;
                    local_a40[1] = fVar52 * fVar76;
                    local_a40[2] = fVar53 * fVar77;
                    local_a40[3] = fVar54 * fVar78;
                    fStack_a30 = fVar55 * 0.0;
                    fStack_a2c = fVar56 * 0.0;
                    fStack_a28 = fVar57 * 0.0;
                    local_a20[0] = fVar58 * fVar69;
                    local_a20[1] = fVar63 * fVar76;
                    local_a20[2] = fVar64 * fVar77;
                    local_a20[3] = fVar65 * fVar78;
                    fStack_a10 = fVar66 * 0.0;
                    fStack_a0c = fVar67 * 0.0;
                    fStack_a08 = fVar68 * 0.0;
                    fStack_a04 = fStack_a24;
                    uVar22 = vmovmskps_avx(local_a60);
                    bVar45 = uVar22 == 0;
                    if (!bVar45) {
                      uVar37 = 0;
                      uVar42 = (ulong)(uVar22 & 0xff);
                      for (uVar27 = uVar42; (uVar27 & 1) == 0;
                          uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                        uVar37 = uVar37 + 1;
                      }
                      local_b60 = CONCAT44(uStack_b58,uStack_b58);
                      auVar85 = auVar122._0_16_;
                      uStack_b54 = uStack_b58;
                      uStack_b50 = uStack_b58;
                      uStack_b4c = uStack_b58;
                      uStack_b48 = uStack_b58;
                      uStack_b44 = uStack_b58;
                      uStack_b3c = local_b40;
                      uStack_b38 = local_b40;
                      uStack_b34 = local_b40;
                      uStack_b30 = local_b40;
                      uStack_b2c = local_b40;
                      uStack_b28 = local_b40;
                      uStack_b24 = local_b40;
                      do {
                        uVar23 = *(undefined4 *)(ray + k * 4 + 0x100);
                        local_8c0 = local_a40[uVar37];
                        fVar57 = local_a20[uVar37];
                        local_8a0._4_4_ = fVar57;
                        local_8a0._0_4_ = fVar57;
                        local_8a0._8_4_ = fVar57;
                        local_8a0._12_4_ = fVar57;
                        local_8a0._16_4_ = fVar57;
                        local_8a0._20_4_ = fVar57;
                        local_8a0._24_4_ = fVar57;
                        local_8a0._28_4_ = fVar57;
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_a00 + uVar37 * 4);
                        uVar25 = *(undefined4 *)(local_9e0 + uVar37 * 4);
                        uVar1 = *(undefined4 *)(local_9c0 + uVar37 * 4);
                        local_900._4_4_ = uVar1;
                        local_900._0_4_ = uVar1;
                        local_900._8_4_ = uVar1;
                        local_900._12_4_ = uVar1;
                        local_900._16_4_ = uVar1;
                        local_900._20_4_ = uVar1;
                        local_900._24_4_ = uVar1;
                        local_900._28_4_ = uVar1;
                        uVar1 = *(undefined4 *)(local_9a0 + uVar37 * 4);
                        local_8e0._4_4_ = uVar1;
                        local_8e0._0_4_ = uVar1;
                        local_8e0._8_4_ = uVar1;
                        local_8e0._12_4_ = uVar1;
                        local_8e0._16_4_ = uVar1;
                        local_8e0._20_4_ = uVar1;
                        local_8e0._24_4_ = uVar1;
                        local_8e0._28_4_ = uVar1;
                        local_b90.context = context->user;
                        local_920[0] = (RTCHitN)(char)uVar25;
                        local_920[1] = (RTCHitN)(char)((uint)uVar25 >> 8);
                        local_920[2] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                        local_920[3] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                        local_920[4] = (RTCHitN)(char)uVar25;
                        local_920[5] = (RTCHitN)(char)((uint)uVar25 >> 8);
                        local_920[6] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                        local_920[7] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                        local_920[8] = (RTCHitN)(char)uVar25;
                        local_920[9] = (RTCHitN)(char)((uint)uVar25 >> 8);
                        local_920[10] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                        local_920[0xb] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                        local_920[0xc] = (RTCHitN)(char)uVar25;
                        local_920[0xd] = (RTCHitN)(char)((uint)uVar25 >> 8);
                        local_920[0xe] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                        local_920[0xf] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                        local_920[0x10] = (RTCHitN)(char)uVar25;
                        local_920[0x11] = (RTCHitN)(char)((uint)uVar25 >> 8);
                        local_920[0x12] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                        local_920[0x13] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                        local_920[0x14] = (RTCHitN)(char)uVar25;
                        local_920[0x15] = (RTCHitN)(char)((uint)uVar25 >> 8);
                        local_920[0x16] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                        local_920[0x17] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                        local_920[0x18] = (RTCHitN)(char)uVar25;
                        local_920[0x19] = (RTCHitN)(char)((uint)uVar25 >> 8);
                        local_920[0x1a] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                        local_920[0x1b] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                        local_920[0x1c] = (RTCHitN)(char)uVar25;
                        local_920[0x1d] = (RTCHitN)(char)((uint)uVar25 >> 8);
                        local_920[0x1e] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                        local_920[0x1f] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                        fStack_8bc = local_8c0;
                        fStack_8b8 = local_8c0;
                        fStack_8b4 = local_8c0;
                        fStack_8b0 = local_8c0;
                        fStack_8ac = local_8c0;
                        fStack_8a8 = local_8c0;
                        fStack_8a4 = local_8c0;
                        local_880 = local_b60;
                        uStack_878 = CONCAT44(uStack_b54,uStack_b58);
                        uStack_870 = CONCAT44(uStack_b4c,uStack_b50);
                        uStack_868 = CONCAT44(uStack_b44,uStack_b48);
                        local_860._4_4_ = uStack_b3c;
                        local_860._0_4_ = local_b40;
                        local_860._8_4_ = uStack_b38;
                        local_860._12_4_ = uStack_b34;
                        local_860._16_4_ = uStack_b30;
                        local_860._20_4_ = uStack_b2c;
                        local_860._24_4_ = uStack_b28;
                        local_860._28_4_ = uStack_b24;
                        vpcmpeqd_avx2(local_860,local_860);
                        uStack_83c = (local_b90.context)->instID[0];
                        local_840 = uStack_83c;
                        uStack_838 = uStack_83c;
                        uStack_834 = uStack_83c;
                        uStack_830 = uStack_83c;
                        uStack_82c = uStack_83c;
                        uStack_828 = uStack_83c;
                        uStack_824 = uStack_83c;
                        uStack_81c = (local_b90.context)->instPrimID[0];
                        local_820 = uStack_81c;
                        uStack_818 = uStack_81c;
                        uStack_814 = uStack_81c;
                        uStack_810 = uStack_81c;
                        uStack_80c = uStack_81c;
                        uStack_808 = uStack_81c;
                        uStack_804 = uStack_81c;
                        local_b20 = local_980._0_8_;
                        uStack_b18 = local_980._8_8_;
                        uStack_b10 = local_980._16_8_;
                        uStack_b08 = local_980._24_8_;
                        local_b90.valid = (int *)&local_b20;
                        local_b90.geometryUserPtr = pGVar4->userPtr;
                        local_b90.hit = local_920;
                        local_b90.N = 8;
                        local_b90.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->occlusionFilterN)(&local_b90);
                        }
                        auVar18._8_8_ = uStack_b18;
                        auVar18._0_8_ = local_b20;
                        auVar18._16_8_ = uStack_b10;
                        auVar18._24_8_ = uStack_b08;
                        auVar48 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar18);
                        auVar90 = _DAT_0205a980 & ~auVar48;
                        if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar90 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar90 >> 0x7f,0) == '\0') &&
                              (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar90 >> 0xbf,0) == '\0') &&
                            (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar90[0x1f]) {
                          auVar48 = auVar48 ^ _DAT_0205a980;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_b90);
                          }
                          auVar19._8_8_ = uStack_b18;
                          auVar19._0_8_ = local_b20;
                          auVar19._16_8_ = uStack_b10;
                          auVar19._24_8_ = uStack_b08;
                          auVar90 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar19
                                                 );
                          auVar48 = auVar90 ^ _DAT_0205a980;
                          auVar75._8_4_ = 0xff800000;
                          auVar75._0_8_ = 0xff800000ff800000;
                          auVar75._12_4_ = 0xff800000;
                          auVar75._16_4_ = 0xff800000;
                          auVar75._20_4_ = 0xff800000;
                          auVar75._24_4_ = 0xff800000;
                          auVar75._28_4_ = 0xff800000;
                          auVar90 = vblendvps_avx(auVar75,*(undefined1 (*) [32])
                                                           (local_b90.ray + 0x100),auVar90);
                          *(undefined1 (*) [32])(local_b90.ray + 0x100) = auVar90;
                        }
                        if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar48 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar48 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar48 >> 0x7f,0) != '\0') ||
                              (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar48 >> 0xbf,0) != '\0') ||
                            (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar48[0x1f] < '\0') {
                          auVar122 = ZEXT1664(auVar85);
                          if (!bVar45) goto LAB_00616fe7;
                          break;
                        }
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar23;
                        uVar27 = uVar37 & 0x3f;
                        uVar37 = 0;
                        uVar42 = uVar42 ^ 1L << uVar27;
                        for (uVar27 = uVar42; (uVar27 & 1) == 0;
                            uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                          uVar37 = uVar37 + 1;
                        }
                        bVar45 = uVar42 == 0;
                        auVar122 = ZEXT1664(auVar85);
                      } while (!bVar45);
                    }
                  }
                }
              }
              uVar43 = uVar43 - 1 & uVar43;
            } while (uVar43 != 0);
          }
          uVar38 = uVar38 + 1;
          bVar44 = uVar38 < uVar26;
        } while (uVar38 != uVar26);
      }
LAB_00616fe7:
      uVar22 = 0;
      if (bVar44) {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar22 = 1;
      }
    }
  } while ((uVar22 & 3) == 0);
  return puVar29 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }